

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void re2::PatchList::Patch(Inst *inst0,PatchList l,uint32_t val)

{
  Inst *this;
  int32_t in_EDX;
  uint in_ESI;
  Inst *in_RDI;
  Inst *ip;
  uint local_4;
  
  local_4 = in_ESI;
  while (local_4 != 0) {
    this = in_RDI + (local_4 >> 1);
    if ((local_4 & 1) == 0) {
      local_4 = Prog::Inst::out(this);
      Prog::Inst::set_out(in_RDI,in_EDX);
    }
    else {
      local_4 = Prog::Inst::out1(this);
      (this->field_1).cap_ = in_EDX;
    }
  }
  return;
}

Assistant:

void PatchList::Patch(Prog::Inst *inst0, PatchList l, uint32_t val) {
  while (l.p != 0) {
    Prog::Inst* ip = &inst0[l.p>>1];
    if (l.p&1) {
      l.p = ip->out1();
      ip->out1_ = val;
    } else {
      l.p = ip->out();
      ip->set_out(val);
    }
  }
}